

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O0

void __thiscall
ExecutionResult::ExecutionResult
          (ExecutionResult *this,shared_ptr<SchemeProcedure> *func,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *args
          )

{
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *args_local;
  shared_ptr<SchemeProcedure> *func_local;
  ExecutionResult *this_local;
  
  this->type = TAIL_CALL;
  std::shared_ptr<SchemeObject>::shared_ptr(&this->value,(nullptr_t)0x0);
  std::
  make_unique<TailContext,std::shared_ptr<SchemeProcedure>const&,std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&>
            ((shared_ptr<SchemeProcedure> *)&this->tail_context,
             (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *
             )func);
  return;
}

Assistant:

ExecutionResult(const std::shared_ptr<SchemeProcedure> &func,
                    const std::list<std::shared_ptr<SchemeObject>> &args) :
        type(execution_result_t::TAIL_CALL), value(nullptr), tail_context(std::make_unique<TailContext>(func, args))
    {}